

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffdrwsll(fitsfile *fptr,LONGLONG *rownum,LONGLONG nrows,int *status)

{
  int iVar1;
  int *status_00;
  int *in_RCX;
  int *in_RDX;
  long *in_RSI;
  int *in_RDI;
  uchar *buffer;
  char comm [73];
  LONGLONG nextrow;
  LONGLONG ii;
  LONGLONG naxis2;
  LONGLONG naxis1;
  LONGLONG nextrowpos;
  LONGLONG insertpos;
  int in_stack_ffffffffffffff5c;
  LONGLONG in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  LONGLONG *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  fitsfile *fptr_00;
  int *in_stack_ffffffffffffffb0;
  long lVar2;
  fitsfile *in_stack_ffffffffffffffb8;
  undefined4 local_40;
  int in_stack_ffffffffffffffc4;
  fitsfile *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RCX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             &in_stack_ffffffffffffffb8->HDUposition,in_stack_ffffffffffffffb0);
    }
    if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
       (iVar1 = ffrdef(stack0x00000058,(int *)comm._64_8_), 0 < iVar1)) {
      iVar1 = *in_RCX;
    }
    else if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      ffpmsg((char *)0x127bf1);
      *in_RCX = 0xeb;
      iVar1 = 0xeb;
    }
    else if ((long)in_RDX < 0) {
      *in_RCX = 0x132;
      iVar1 = 0x132;
    }
    else if (in_RDX == (int *)0x0) {
      iVar1 = *in_RCX;
    }
    else {
      ffgkyjj(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
              (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      ffgkyjj(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
              (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      for (lVar2 = 1; lVar2 < (long)in_RDX; lVar2 = lVar2 + 1) {
        if (in_RSI[lVar2] <= in_RSI[lVar2 + -1]) {
          ffpmsg((char *)0x127cf3);
          *in_RCX = 0x133;
          return 0x133;
        }
      }
      if (*in_RSI < 1) {
        ffpmsg((char *)0x127d3d);
        *in_RCX = 0x133;
        iVar1 = 0x133;
      }
      else if ((long)in_stack_ffffffffffffffb8 < in_RSI[(long)in_RDX + -1]) {
        ffpmsg((char *)0x127d86);
        *in_RCX = 0x133;
        iVar1 = 0x133;
      }
      else {
        status_00 = (int *)malloc(CONCAT44(in_stack_ffffffffffffffc4,local_40));
        if (status_00 == (int *)0x0) {
          ffpmsg((char *)0x127dc9);
          *in_RCX = 0x71;
          iVar1 = 0x71;
        }
        else {
          fptr_00 = (fitsfile *)*in_RSI;
          lVar2 = 1;
          do {
            while( true ) {
              fptr_00 = (fitsfile *)((long)&fptr_00->HDUposition + 1);
              if ((long)in_RDX <= lVar2) {
                while( true ) {
                  if ((long)in_stack_ffffffffffffffb8 < (long)fptr_00) {
                    free(status_00);
                    ffdrow((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,(LONGLONG)in_RDI,(LONGLONG)in_RSI,in_RDX);
                    ffcmph(fptr,(int *)rownum);
                    return *in_RCX;
                  }
                  ffmbyt(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff5c,status_00);
                  ffgbyt(fptr_00,(LONGLONG)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90);
                  ffmbyt(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff5c,status_00);
                  ffpbyt(in_stack_ffffffffffffffb8,lVar2,fptr_00,in_stack_ffffffffffffffa0);
                  if (0 < *in_RCX) break;
                  fptr_00 = (fitsfile *)((long)&fptr_00->HDUposition + 1);
                }
                ffpmsg((char *)0x12802c);
                free(status_00);
                return *in_RCX;
              }
              if ((long)fptr_00 < in_RSI[lVar2]) break;
              lVar2 = lVar2 + 1;
            }
            ffmbyt(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                   status_00);
            ffgbyt(fptr_00,(LONGLONG)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90);
            ffmbyt(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                   status_00);
            ffpbyt(in_stack_ffffffffffffffb8,lVar2,fptr_00,in_stack_ffffffffffffffa0);
          } while (*in_RCX < 1);
          ffpmsg((char *)0x127f13);
          free(status_00);
          iVar1 = *in_RCX;
        }
      }
    }
  }
  else {
    iVar1 = *in_RCX;
  }
  return iVar1;
}

Assistant:

int ffdrwsll(fitsfile *fptr, /* I - FITS file pointer                        */
           LONGLONG *rownum, /* I - list of rows to delete (1 = first)       */
           LONGLONG nrows,  /* I - number of rows to delete                 */
           int *status)     /* IO - error status                            */
/*
 delete the list of rows from the table (1 = first row of table).
*/
{
    LONGLONG insertpos, nextrowpos;
    LONGLONG naxis1, naxis2, ii, nextrow;
    char comm[FLEN_COMMENT];
    unsigned char *buffer;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrws)");
        return(*status = NOT_TABLE);
    }

    if (nrows < 0 )
        return(*status = NEG_BYTES);
    else if (nrows == 0)
        return(*status);   /* no op, so just return */

    ffgkyjj(fptr, "NAXIS1", &naxis1, comm, status); /* row width   */
    ffgkyjj(fptr, "NAXIS2", &naxis2, comm, status); /* number of rows */

    /* check that input row list is in ascending order */
    for (ii = 1; ii < nrows; ii++)
    {
        if (rownum[ii - 1] >= rownum[ii])
        {
            ffpmsg("row numbers are not in increasing order (ffdrws)");
            return(*status = BAD_ROW_NUM);
        }
    }

    if (rownum[0] < 1)
    {
        ffpmsg("first row to delete is less than 1 (ffdrws)");
        return(*status = BAD_ROW_NUM);
    }
    else if (rownum[nrows - 1] > naxis2)
    {
        ffpmsg("last row to delete exceeds size of table (ffdrws)");
        return(*status = BAD_ROW_NUM);
    }

    buffer = (unsigned char *) malloc( (size_t) naxis1);  /* buffer for one row */

    if (!buffer)
    {
        ffpmsg("malloc failed (ffdrwsll)");
        return(*status = MEMORY_ALLOCATION);
    }

    /* byte location to start of first row to delete, and the next row */
    insertpos = (fptr->Fptr)->datastart + ((rownum[0] - 1) * naxis1);
    nextrowpos = insertpos + naxis1;
    nextrow = rownum[0] + 1;

    /* work through the list of rows to delete */
    for (ii = 1; ii < nrows; nextrow++, nextrowpos += naxis1)
    {
        if (nextrow < rownum[ii])  
        {   /* keep this row, so copy it to the new position */

            ffmbyt(fptr, nextrowpos, REPORT_EOF, status);
            ffgbyt(fptr, naxis1, buffer, status);  /* read the bytes */

            ffmbyt(fptr, insertpos, IGNORE_EOF, status);
            ffpbyt(fptr, naxis1, buffer, status);  /* write the bytes */

            if (*status > 0)
            {
                ffpmsg("error while copying good rows in table (ffdrws)");
                free(buffer);
                return(*status);
            }
            insertpos += naxis1;
        }
        else
        {   /* skip over this row since it is in the list */
            ii++;
        }
    }

    /* finished with all the rows to delete; copy remaining rows */
    while(nextrow <= naxis2)
    {
        ffmbyt(fptr, nextrowpos, REPORT_EOF, status);
        ffgbyt(fptr, naxis1, buffer, status);  /* read the bytes */

        ffmbyt(fptr, insertpos, IGNORE_EOF, status);
        ffpbyt(fptr, naxis1, buffer, status);  /* write the bytes */

        if (*status > 0)
        {
            ffpmsg("failed to copy remaining rows in table (ffdrws)");
            free(buffer);
            return(*status);
        }
        insertpos  += naxis1;
        nextrowpos += naxis1;
        nextrow++; 
    }
    free(buffer);
    
    /* now delete the empty rows at the end of the table */
    ffdrow(fptr, naxis2 - nrows + 1, nrows, status);

    /* Update the heap data, if any.  This will remove any orphaned data */
    /* that was only pointed to by the rows that have been deleted */
    ffcmph(fptr, status);
    
    return(*status);
}